

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O1

void __thiscall HACD::HACD::InitializeDualGraph(HACD *this)

{
  Vec3<double> *pVVar1;
  Vec3<long> *pVVar2;
  Vec3<double> *pVVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  HACD *pHVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ICHUll *this_00;
  long lVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  size_t sVar22;
  double dVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  Vec3<double> normal;
  Vec3<double> seedPoint;
  long hitTriangle;
  Vec3<double> hitNormal;
  Vec3<double> hitPoint;
  Float dist;
  RaycastMesh rm;
  char msg [1024];
  double local_598;
  Vec3<double> local_590;
  double local_578;
  double local_570;
  undefined1 local_568 [24];
  ulong local_550;
  double local_548;
  undefined8 uStack_540;
  double local_530;
  HACD *local_528;
  long local_520;
  long local_518;
  long local_510;
  long local_508;
  double local_500;
  ulong local_4f8;
  DPoint local_4f0;
  Vec3<double> local_4d8;
  Vec3<double> local_4c0;
  Float local_4a8;
  RaycastMesh local_4a0;
  char local_438 [1032];
  
  pVVar1 = this->m_normals;
  if (pVVar1 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
  }
  uVar24 = this->m_nPoints;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar24;
  uVar15 = SUB168(auVar25 * ZEXT816(0x18),0);
  uVar16 = uVar15 + 8;
  if (0xfffffffffffffff7 < uVar15) {
    uVar16 = 0xffffffffffffffff;
  }
  uVar15 = 0xffffffffffffffff;
  if (SUB168(auVar25 * ZEXT816(0x18),8) == 0) {
    uVar15 = uVar16;
  }
  puVar17 = (ulong *)operator_new__(uVar15);
  *puVar17 = uVar24;
  this->m_normals = (Vec3<double> *)(puVar17 + 1);
  if (this->m_addFacesPoints == true) {
    pVVar1 = this->m_facePoints;
    if (pVVar1 != (Vec3<double> *)0x0) {
      operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
    }
    pVVar1 = this->m_faceNormals;
    if (pVVar1 != (Vec3<double> *)0x0) {
      operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
    }
    uVar24 = this->m_nTriangles;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar24;
    uVar15 = SUB168(auVar4 * ZEXT816(0x18),0);
    uVar16 = uVar15 + 8;
    if (0xfffffffffffffff7 < uVar15) {
      uVar16 = 0xffffffffffffffff;
    }
    uVar15 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar15 = uVar16;
    }
    puVar17 = (ulong *)operator_new__(uVar15);
    *puVar17 = uVar24;
    this->m_facePoints = (Vec3<double> *)(puVar17 + 1);
    puVar17 = (ulong *)operator_new__(uVar15);
    *puVar17 = uVar24;
    this->m_faceNormals = (Vec3<double> *)(puVar17 + 1);
  }
  memset(this->m_normals,0,this->m_nPoints * 0x18);
  RaycastMesh::RaycastMesh(&local_4a0);
  if (this->m_addExtraDistPoints == true) {
    RaycastMesh::Initialize
              (&local_4a0,this->m_nPoints,this->m_nTriangles,this->m_points,this->m_triangles,0xf,4,
               2.0);
    uVar24 = this->m_nTriangles;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar24;
    uVar15 = SUB168(auVar5 * ZEXT816(0x18),0);
    uVar16 = uVar15 + 8;
    if (0xfffffffffffffff7 < uVar15) {
      uVar16 = 0xffffffffffffffff;
    }
    if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    puVar17 = (ulong *)operator_new__(uVar16);
    *puVar17 = uVar24;
    this->m_extraDistPoints = (Vec3<double> *)(puVar17 + 1);
    puVar17 = (ulong *)operator_new__(uVar16);
    *puVar17 = uVar24;
    this->m_extraDistNormals = (Vec3<double> *)(puVar17 + 1);
  }
  this->m_area = 0.0;
  uVar24 = this->m_nTriangles;
  if (uVar24 != 0) {
    local_530 = -1.0;
    lVar20 = 0x10;
    dVar23 = -NAN;
    dVar21 = 0.0;
    uVar15 = 0;
    local_528 = this;
    do {
      auVar25 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,uVar15);
      auVar4 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,uVar24);
      dVar26 = (auVar25._0_8_ * 100.0) / auVar4._0_8_;
      auVar11._8_8_ = 0x7fffffffffffffff;
      auVar11._0_8_ = 0x7fffffffffffffff;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar26 - local_530;
      auVar25 = vandpd_avx512vl(auVar35,auVar11);
      local_550 = uVar15;
      if ((1.0 < auVar25._0_8_) && (this->m_callBack != (CallBackFunction)0x0)) {
        sprintf(local_438,"%3.2f %% \t \t \r");
        (*this->m_callBack)(local_438,dVar26,0.0,this->m_nTriangles);
        local_530 = dVar26;
      }
      pVVar2 = this->m_triangles;
      local_578 = *(double *)((long)pVVar2->m_data + lVar20 + -0x10);
      dVar26 = *(double *)((long)pVVar2->m_data + lVar20 + -8);
      local_598 = *(double *)((long)pVVar2->m_data + lVar20);
      local_568._8_8_ = 0.0;
      local_568._16_8_ = local_568._16_8_ & 0xffffffffffff0000;
      local_568._0_8_ = local_578;
      SArray<HACD::DPoint,_16UL>::PushBack
                ((SArray<HACD::DPoint,_16UL> *)
                 ((long)&(((this->m_graph).m_vertices.
                           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_distPoints).m_data0[0].
                         m_name + (long)dVar21),(DPoint *)local_568);
      local_568._8_8_ = 0.0;
      local_568._16_8_ = local_568._16_8_ & 0xffffffffffff0000;
      local_568._0_8_ = dVar26;
      local_548 = dVar26;
      SArray<HACD::DPoint,_16UL>::PushBack
                ((SArray<HACD::DPoint,_16UL> *)
                 ((long)&(((this->m_graph).m_vertices.
                           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_distPoints).m_data0[0].
                         m_name + (long)dVar21),(DPoint *)local_568);
      local_568._8_8_ = 0.0;
      local_568._16_8_ = local_568._16_8_ & 0xffffffffffff0000;
      local_568._0_8_ = local_598;
      SArray<HACD::DPoint,_16UL>::PushBack
                ((SArray<HACD::DPoint,_16UL> *)
                 ((long)&(((this->m_graph).m_vertices.
                           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_distPoints).m_data0[0].
                         m_name + (long)dVar21),(DPoint *)local_568);
      this_00 = (ICHUll *)::operator_new(0x110);
      ICHUll::ICHUll(this_00,this->m_heapManager);
      *(ICHUll **)
       ((long)(((this->m_graph).m_vertices.
                super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                super__Vector_impl_data._M_start)->m_boudaryEdges).m_data0 + (long)dVar21 + -8) =
           this_00;
      local_510 = (long)local_578 * 3;
      ICHUll::AddPoint(this_00,this->m_points + (long)local_578,(long)local_578);
      local_518 = (long)local_548 * 3;
      ICHUll::AddPoint(this_00,this->m_points + (long)local_548,(long)local_548);
      local_520 = (long)local_598 * 3;
      ICHUll::AddPoint(this_00,this->m_points + (long)local_598,(long)local_598);
      this_00->m_distPoints =
           (map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
            *)0x0;
      pVVar1 = this->m_points;
      dVar26 = pVVar1[(long)local_548].m_data[0] - pVVar1[(long)local_578].m_data[0];
      dVar6 = pVVar1[(long)local_548].m_data[1] - pVVar1[(long)local_578].m_data[1];
      dVar7 = pVVar1[(long)local_548].m_data[2] - pVVar1[(long)local_578].m_data[2];
      in_ZMM4 = ZEXT864((ulong)dVar7);
      dVar8 = pVVar1[(long)local_598].m_data[0] - pVVar1[(long)local_578].m_data[0];
      dVar9 = pVVar1[(long)local_598].m_data[1] - pVVar1[(long)local_578].m_data[1];
      dVar10 = pVVar1[(long)local_598].m_data[2] - pVVar1[(long)local_578].m_data[2];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar6;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar10;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar9 * dVar7;
      auVar25 = vfmsub231sd_fma(auVar49,auVar36,auVar47);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar8;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar7;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar10 * dVar26;
      auVar4 = vfmsub231sd_fma(auVar48,auVar43,auVar46);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar26;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar8 * dVar6;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar9;
      auVar5 = vfmsub231sd_fma(auVar37,auVar27,auVar45);
      local_590.m_data[0] = auVar25._0_8_;
      local_590.m_data[1] = auVar4._0_8_;
      local_590.m_data[2] = auVar5._0_8_;
      pVVar1 = this->m_normals;
      pVVar1[(long)local_578].m_data[0] = local_590.m_data[0] + pVVar1[(long)local_578].m_data[0];
      pVVar1[(long)local_578].m_data[1] = local_590.m_data[1] + pVVar1[(long)local_578].m_data[1];
      pVVar1[(long)local_578].m_data[2] = local_590.m_data[2] + pVVar1[(long)local_578].m_data[2];
      pVVar1[(long)local_548].m_data[0] = local_590.m_data[0] + pVVar1[(long)local_548].m_data[0];
      pVVar1[(long)local_548].m_data[1] = local_590.m_data[1] + pVVar1[(long)local_548].m_data[1];
      pVVar1[(long)local_548].m_data[2] = local_590.m_data[2] + pVVar1[(long)local_548].m_data[2];
      pVVar1[(long)local_598].m_data[0] = local_590.m_data[0] + pVVar1[(long)local_598].m_data[0];
      pVVar1[(long)local_598].m_data[1] = local_590.m_data[1] + pVVar1[(long)local_598].m_data[1];
      pVVar1[(long)local_598].m_data[2] = local_590.m_data[2] + pVVar1[(long)local_598].m_data[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_590.m_data[0];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_590.m_data[1] * local_590.m_data[1];
      auVar25 = vfmadd231sd_fma(auVar38,auVar28,auVar28);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_590.m_data[2];
      auVar25 = vfmadd213sd_fma(auVar29,auVar29,auVar25);
      if (auVar25._0_8_ < 0.0) {
        dVar26 = sqrt(auVar25._0_8_);
      }
      else {
        auVar25 = vsqrtsd_avx(auVar25,auVar25);
        dVar26 = auVar25._0_8_;
      }
      *(double *)
       ((long)(((this->m_graph).m_vertices.
                super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                super__Vector_impl_data._M_start)->m_boudaryEdges).m_data0 + (long)dVar21 + -0x10) =
           dVar26;
      this->m_area = dVar26 + this->m_area;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_590.m_data[0];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_590.m_data[1] * local_590.m_data[1];
      auVar25 = vfmadd231sd_fma(auVar39,auVar30,auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_590.m_data[2];
      auVar25 = vfmadd213sd_fma(auVar31,auVar31,auVar25);
      if (auVar25._0_8_ < 0.0) {
        dVar26 = sqrt(auVar25._0_8_);
      }
      else {
        auVar25 = vsqrtsd_avx(auVar25,auVar25);
        dVar26 = auVar25._0_8_;
      }
      pHVar13 = local_528;
      dVar6 = local_548;
      if ((dVar26 != 0.0) || (NAN(dVar26))) {
        local_590.m_data[0] = local_590.m_data[0] / dVar26;
        local_590.m_data[1] = local_590.m_data[1] / dVar26;
        local_590.m_data[2] = local_590.m_data[2] / dVar26;
      }
      lVar19 = (long)local_578 << 0x20;
      lVar18 = (long)local_548 << 0x20;
      local_568._0_8_ = lVar18 + (long)local_578;
      if ((ulong)local_548 < (ulong)local_578) {
        local_568._0_8_ = lVar19 + (long)local_548;
      }
      local_570 = dVar21;
      local_508 = lVar20;
      local_500 = dVar23;
      SArray<unsigned_long_long,_16UL>::Insert
                ((SArray<unsigned_long_long,_16UL> *)
                 ((long)(((local_528->m_graph).m_vertices.
                          super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_boudaryEdges).m_data0 +
                 (long)dVar21),(unsigned_long_long *)local_568);
      local_568._0_8_ = ((long)local_598 << 0x20) + (long)dVar6;
      if ((ulong)local_598 < (ulong)dVar6) {
        local_568._0_8_ = lVar18 + (long)local_598;
      }
      SArray<unsigned_long_long,_16UL>::Insert
                ((SArray<unsigned_long_long,_16UL> *)
                 ((long)(((pHVar13->m_graph).m_vertices.
                          super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_boudaryEdges).m_data0 +
                 (long)dVar21),(unsigned_long_long *)local_568);
      this = local_528;
      local_568._0_8_ = lVar19 + (long)local_598;
      if ((ulong)local_578 < (ulong)local_598) {
        local_568._0_8_ = ((long)local_598 << 0x20) + (long)local_578;
      }
      SArray<unsigned_long_long,_16UL>::Insert
                ((SArray<unsigned_long_long,_16UL> *)
                 ((long)(((local_528->m_graph).m_vertices.
                          super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_boudaryEdges).m_data0 +
                 (long)local_570),(unsigned_long_long *)local_568);
      dVar23 = local_500;
      lVar20 = local_508;
      dVar21 = local_570;
      if (this->m_addFacesPoints == true) {
        pVVar1 = this->m_faceNormals;
        *(double *)((long)pVVar1->m_data + local_508 + -0x10) = local_590.m_data[0];
        *(double *)((long)pVVar1->m_data + local_508 + -8) = local_590.m_data[1];
        *(double *)((long)pVVar1->m_data + local_508) = local_590.m_data[2];
        pVVar1 = this->m_points;
        pVVar3 = this->m_facePoints;
        dVar26 = pVVar1->m_data[local_510 + 1];
        dVar6 = pVVar1->m_data[local_518 + 1];
        dVar7 = pVVar1->m_data[local_510 + 2];
        dVar8 = pVVar1->m_data[local_518 + 2];
        dVar9 = pVVar1->m_data[local_520 + 1];
        dVar10 = pVVar1->m_data[local_520 + 2];
        *(double *)((long)pVVar3->m_data + local_508 + -0x10) =
             (pVVar1->m_data[local_510] + pVVar1->m_data[local_518] + pVVar1->m_data[local_520]) /
             3.0;
        *(double *)((long)pVVar3->m_data + local_508 + -8) = (dVar26 + dVar6 + dVar9) / 3.0;
        *(double *)((long)pVVar3->m_data + local_508) = (dVar7 + dVar8 + dVar10) / 3.0;
        local_568._0_8_ = local_500;
        local_568._8_8_ = 0.0;
        local_568._16_2_ = 0x100;
        SArray<HACD::DPoint,_16UL>::PushBack
                  ((SArray<HACD::DPoint,_16UL> *)
                   ((long)&(((this->m_graph).m_vertices.
                             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_distPoints).m_data0[0].
                           m_name + (long)local_570),(DPoint *)local_568);
      }
      uVar15 = local_550 + 1;
      uVar24 = this->m_nTriangles;
      lVar20 = lVar20 + 0x18;
      dVar23 = (double)((long)dVar23 + -1);
      dVar21 = (double)((long)dVar21 + 0x310);
    } while (uVar15 < uVar24);
  }
  dVar21 = local_548;
  if (this->m_addExtraDistPoints != false) {
    if (this->m_callBack != (CallBackFunction)0x0) {
      (*this->m_callBack)("++ Also adding distance points\n",0.0,0.0,0);
    }
    sVar22 = this->m_nTriangles;
    if (0 < (long)sVar22) {
      local_570 = -1.0;
      lVar20 = 0x10;
      local_550 = 200;
      local_578 = (double)((long)local_578 * 3);
      lVar18 = 0;
      local_548 = -0.0;
      uStack_540 = 0x8000000000000000;
      do {
        pVVar1 = this->m_points;
        local_568._0_8_ =
             (pVVar1->m_data[(long)local_578] + pVVar1[(long)dVar21].m_data[0] +
             pVVar1[(long)local_598].m_data[0]) / 3.0;
        local_568._8_8_ =
             (pVVar1->m_data[(long)local_578 + 1] + pVVar1[(long)dVar21].m_data[1] +
             pVVar1[(long)local_598].m_data[1]) / 3.0;
        local_568._16_8_ =
             (pVVar1->m_data[(long)local_578 + 2] + pVVar1[(long)dVar21].m_data[2] +
             pVVar1[(long)local_598].m_data[2]) / 3.0;
        auVar32._0_8_ = (ulong)local_590.m_data[0] ^ (ulong)local_548;
        auVar32._8_8_ = uStack_540;
        auVar40._0_8_ = (ulong)local_590.m_data[1] ^ (ulong)local_548;
        auVar40._8_8_ = uStack_540;
        auVar44._0_8_ = (ulong)local_590.m_data[2] ^ (ulong)local_548;
        auVar44._8_8_ = uStack_540;
        local_590.m_data[0] = (double)vmovlpd_avx(auVar32);
        local_590.m_data[1] = (double)vmovlpd_avx(auVar40);
        local_590.m_data[2] = (double)vmovlpd_avx(auVar44);
        bVar14 = RaycastMesh::Raycast
                           (&local_4a0,(Vec3<double> *)local_568,&local_590,(long *)&local_4f8,
                            &local_4a8,&local_4c0,&local_4d8);
        if (bVar14) {
          sVar22 = local_4f8;
        }
        if (sVar22 < this->m_nTriangles) {
          pVVar1 = this->m_extraDistPoints;
          *(double *)((long)pVVar1->m_data + lVar20 + -0x10) = local_4c0.m_data[0];
          *(double *)((long)pVVar1->m_data + lVar20 + -8) = local_4c0.m_data[1];
          *(double *)((long)pVVar1->m_data + lVar20) = local_4c0.m_data[2];
          pVVar1 = this->m_extraDistNormals;
          *(double *)((long)pVVar1->m_data + lVar20 + -0x10) = local_4d8.m_data[0];
          *(double *)((long)pVVar1->m_data + lVar20 + -8) = local_4d8.m_data[1];
          *(double *)((long)pVVar1->m_data + lVar20) = local_4d8.m_data[2];
          local_4f0.m_name = this->m_nPoints + lVar18;
          local_4f0.m_dist = 0.0;
          local_4f0.m_computed = false;
          local_4f0.m_distOnly = true;
          SArray<HACD::DPoint,_16UL>::PushBack
                    ((SArray<HACD::DPoint,_16UL> *)
                     ((long)(((this->m_graph).m_vertices.
                              super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                     (local_550 - 0x10)),&local_4f0);
        }
        lVar18 = lVar18 + 1;
        auVar25 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,this->m_nTriangles);
        dVar23 = ((double)lVar18 * 100.0) / auVar25._0_8_;
        auVar12._8_8_ = 0x7fffffffffffffff;
        auVar12._0_8_ = 0x7fffffffffffffff;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar23 - local_570;
        auVar25 = vandpd_avx512vl(auVar41,auVar12);
        if ((1.0 < auVar25._0_8_) && (this->m_callBack != (CallBackFunction)0x0)) {
          sprintf(local_438,"%3.2f %% \t \t \r");
          (*this->m_callBack)(local_438,dVar23,0.0,this->m_nTriangles);
          local_570 = dVar23;
        }
        sVar22 = this->m_nTriangles;
        lVar20 = lVar20 + 0x18;
        local_550 = local_550 + 0x310;
      } while (lVar18 < (long)sVar22);
    }
  }
  if (this->m_nPoints != 0) {
    lVar20 = 0x10;
    uVar24 = 0;
    do {
      pVVar1 = this->m_normals;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)pVVar1->m_data + lVar20 + -0x10);
      dVar21 = *(double *)((long)pVVar1->m_data + lVar20 + -8);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar21 * dVar21;
      auVar25 = vfmadd231sd_fma(auVar42,auVar33,auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)((long)pVVar1->m_data + lVar20);
      auVar25 = vfmadd213sd_fma(auVar34,auVar34,auVar25);
      if (auVar25._0_8_ < 0.0) {
        dVar21 = sqrt(auVar25._0_8_);
      }
      else {
        auVar25 = vsqrtsd_avx(auVar25,auVar25);
        dVar21 = auVar25._0_8_;
      }
      if ((dVar21 != 0.0) || (NAN(dVar21))) {
        *(double *)((long)pVVar1->m_data + lVar20 + -0x10) =
             *(double *)((long)pVVar1->m_data + lVar20 + -0x10) / dVar21;
        *(double *)((long)pVVar1->m_data + lVar20 + -8) =
             *(double *)((long)pVVar1->m_data + lVar20 + -8) / dVar21;
        *(double *)((long)pVVar1->m_data + lVar20) =
             *(double *)((long)pVVar1->m_data + lVar20) / dVar21;
      }
      uVar24 = uVar24 + 1;
      lVar20 = lVar20 + 0x18;
    } while (uVar24 < this->m_nPoints);
  }
  RaycastMesh::~RaycastMesh(&local_4a0);
  return;
}

Assistant:

void HACD::InitializeDualGraph()
    {
        long i, j, k;
        Vec3<Real> u, v, w, normal;
		delete [] m_normals;
		m_normals = new Vec3<Real>[m_nPoints];
        if (m_addFacesPoints)
        {
            delete [] m_facePoints;
            delete [] m_faceNormals;
            
			m_facePoints = new Vec3<Real>[m_nTriangles];
            m_faceNormals = new Vec3<Real>[m_nTriangles];
/*
            m_facePoints = new Vec3<Real>[4*m_nTriangles];
            m_faceNormals = new Vec3<Real>[4*m_nTriangles];
*/
        }
		memset(m_normals, 0, sizeof(Vec3<Real>) * m_nPoints);

        RaycastMesh rm;
        if (m_addExtraDistPoints)
        {
            rm.Initialize(m_nPoints, m_nTriangles, m_points, m_triangles, 15);
            m_extraDistPoints = new Vec3<Real>[m_nTriangles];
            m_extraDistNormals = new Vec3<Real>[m_nTriangles];
        }
        double progressOld = -1.0;
        double progress = 0.0;
		char msg[1024];
		double ptgStep = 1.0;
		m_area = 0.0;				
		for(unsigned long f = 0; f < m_nTriangles; f++)
        {
            progress = f * 100.0 / m_nTriangles;
            if (fabs(progress-progressOld) > ptgStep && m_callBack)
            {
				sprintf(msg, "%3.2f %% \t \t \r", progress);
				(*m_callBack)(msg, progress, 0.0,  m_nTriangles);
                progressOld = progress;
            }

			i = m_triangles[f].X();
            j = m_triangles[f].Y();
            k = m_triangles[f].Z();
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(i, 0, false, false));
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(j, 0, false, false));
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(k, 0, false, false));
            
            ICHUll  * ch = new ICHUll(m_heapManager);
            m_graph.m_vertices[f].m_convexHull = ch;
            ch->AddPoint(m_points[i], i);
            ch->AddPoint(m_points[j], j);
            ch->AddPoint(m_points[k], k);
			ch->SetDistPoints(0);

			u = m_points[j] - m_points[i];
			v = m_points[k] - m_points[i];
			w = m_points[k] - m_points[j];
			normal = u ^ v;

			m_normals[i] += normal;
			m_normals[j] += normal;
			m_normals[k] += normal;

			m_graph.m_vertices[f].m_surf = normal.GetNorm();
			m_area += m_graph.m_vertices[f].m_surf;
            normal.Normalize();
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(i,j));
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(j,k));
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(k,i));
            if(m_addFacesPoints)
            {
                m_faceNormals[f] = normal;
                m_facePoints[f] = (m_points[i] + m_points[j] + m_points[k]) / 3.0;
				m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(-static_cast<long>(f)-1, 0, false, true));
            }
        }

		// Now we have all the points in the KD tree, optimize the distance points insertion by running them in parallel
		// if possible. 
		if (m_addExtraDistPoints)	
        {
			if (m_callBack)
				(*m_callBack)("++ Also adding distance points\n", 0.0, 0.0, 0);

	        progressOld = -1.0;
			progress = 0.0;
			long completed = 0;

#ifdef THREAD_DIST_POINTS
#pragma omp parallel for
#endif
			for(long f = 0; f < (long)m_nTriangles; f++)
			{
				Vec3<Real> seedPoint((m_points[i] + m_points[j] + m_points[k]) / 3.0);
				Vec3<Real> hitPoint;
				Vec3<Real> hitNormal;
				normal = -normal;
                size_t faceIndex = m_nTriangles;

				Float dist;
				long hitTriangle;
				if (rm.Raycast(seedPoint,normal,hitTriangle,dist, hitPoint, hitNormal))
				{
					faceIndex = hitTriangle;
				}

                if (faceIndex < m_nTriangles )
                {
					m_extraDistPoints[f] = hitPoint;
					m_extraDistNormals[f] = hitNormal;
					m_graph.m_vertices[f].m_distPoints.PushBack(DPoint((long)(m_nPoints+f), 0, false, true));
				}

				// Atomic update of the progress
				#ifdef THREAD_DIST_POINTS
				#pragma omp critical
				#endif
				{
					completed++;
				
					progress = completed * 100.0 / m_nTriangles;
					if (fabs(progress-progressOld) > ptgStep && m_callBack)
					{
						sprintf(msg, "%3.2f %% \t \t \r", progress);
						(*m_callBack)(msg, progress, 0.0,  m_nTriangles);
						progressOld = progress;
					}
				}        
			}
		}

        for (size_t v = 0; v < m_nPoints; v++) 
		{
			m_normals[v].Normalize();
		}
    }